

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O2

int cmdline_parser_required2(gengetopt_args_info *args_info,char *prog_name,char *additional_error)

{
  uint uVar1;
  bool bVar2;
  
  bVar2 = args_info->input_given == 0;
  if (bVar2) {
    fprintf(_stderr,"%s: \'--input\' (\'-i\') option required%s\n",prog_name,"");
  }
  uVar1 = (uint)bVar2;
  if (args_info->sequentialProps_group_counter == 0) {
    uVar1 = 1;
    fprintf(_stderr,"%s: %d options of group sequentialProps were given. One is required%s.\n",
            prog_name,0,"");
  }
  return uVar1;
}

Assistant:

int
cmdline_parser_required2 (struct gengetopt_args_info *args_info, const char *prog_name, const char *additional_error)
{
  int error_occurred = 0;
  FIX_UNUSED (additional_error);

  /* checks for required options */
  if (! args_info->input_given)
    {
      fprintf (stderr, "%s: '--input' ('-i') option required%s\n", prog_name, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  
  if (args_info->sequentialProps_group_counter == 0)
    {
      fprintf (stderr, "%s: %d options of group sequentialProps were given. One is required%s.\n", prog_name, args_info->sequentialProps_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  

  /* checks for dependences among options */

  return error_occurred;
}